

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBOCache.cpp
# Opt level: O0

GLFrameBufferObj * __thiscall
Diligent::FBOCache::GetFBO(FBOCache *this,Uint32 Width,Uint32 Height,GLContextState *ContextState)

{
  bool bVar1;
  _Node_iterator<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false,_false>
  _Var2;
  Char *Message;
  pointer ppVar3;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false,_false>,_bool>
  pVar4;
  undefined1 local_248 [8];
  string msg;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false,_false>,_bool>
  it_inserted;
  GLFrameBufferObj NewFBO;
  _Node_iterator_base<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false>
  local_1d8;
  iterator fbo_it;
  SpinLockGuard CacheGuard;
  FBOCacheKey Key;
  GLContextState *ContextState_local;
  Uint32 Height_local;
  Uint32 Width_local;
  FBOCache *this_local;
  
  FBOCacheKey::FBOCacheKey((FBOCacheKey *)&CacheGuard);
  std::lock_guard<Threading::SpinLock>::lock_guard
            ((lock_guard<Threading::SpinLock> *)&fbo_it,&this->m_CacheLock);
  local_1d8._M_cur =
       (__node_type *)
       std::
       unordered_map<Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj,_Diligent::FBOCache::FBOCacheKeyHashFunc,_std::equal_to<Diligent::FBOCache::FBOCacheKey>,_std::allocator<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>_>_>
       ::find(&this->m_Cache,(FBOCacheKey *)&CacheGuard);
  NewFBO._12_8_ =
       std::
       unordered_map<Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj,_Diligent::FBOCache::FBOCacheKeyHashFunc,_std::equal_to<Diligent::FBOCache::FBOCacheKey>,_std::allocator<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>_>_>
       ::end(&this->m_Cache);
  bVar1 = std::__detail::operator==
                    (&local_1d8,
                     (_Node_iterator_base<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false>
                      *)&NewFBO.m_NumDrawBuffers);
  if (bVar1) {
    CreateFBO((GLFrameBufferObj *)&it_inserted.field_0xc,ContextState,0,(TextureViewGLImpl **)0x0,
              (TextureViewGLImpl *)0x0,Width,Height);
    pVar4 = std::
            unordered_map<Diligent::FBOCache::FBOCacheKey,GLObjectWrappers::GLFrameBufferObj,Diligent::FBOCache::FBOCacheKeyHashFunc,std::equal_to<Diligent::FBOCache::FBOCacheKey>,std::allocator<std::pair<Diligent::FBOCache::FBOCacheKey_const,GLObjectWrappers::GLFrameBufferObj>>>
            ::emplace<Diligent::FBOCache::FBOCacheKey&,GLObjectWrappers::GLFrameBufferObj>
                      ((unordered_map<Diligent::FBOCache::FBOCacheKey,GLObjectWrappers::GLFrameBufferObj,Diligent::FBOCache::FBOCacheKeyHashFunc,std::equal_to<Diligent::FBOCache::FBOCacheKey>,std::allocator<std::pair<Diligent::FBOCache::FBOCacheKey_const,GLObjectWrappers::GLFrameBufferObj>>>
                        *)&this->m_Cache,(FBOCacheKey *)&CacheGuard,
                       (GLFrameBufferObj *)&it_inserted.field_0xc);
    _Var2 = pVar4.first.
            super__Node_iterator_base<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false>
            ._M_cur;
    it_inserted.first.
    super__Node_iterator_base<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false>
    ._M_cur._0_1_ = pVar4.second;
    msg.field_2._8_8_ =
         _Var2.
         super__Node_iterator_base<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false>
         ._M_cur;
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      FormatString<char[25]>((string *)local_248,(char (*) [25])"New FBO was not inserted");
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"GetFBO",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/FBOCache.cpp"
                 ,0x13a);
      std::__cxx11::string::~string((string *)local_248);
    }
    local_1d8 = _Var2.
                super__Node_iterator_base<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false>
                ._M_cur;
    GLObjectWrappers::GLFrameBufferObj::~GLFrameBufferObj
              ((GLFrameBufferObj *)&it_inserted.field_0xc);
  }
  ppVar3 = std::__detail::
           _Node_iterator<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false,_false>
                         *)&local_1d8);
  std::lock_guard<Threading::SpinLock>::~lock_guard((lock_guard<Threading::SpinLock> *)&fbo_it);
  return &ppVar3->second;
}

Assistant:

const GLObjectWrappers::GLFrameBufferObj& FBOCache::GetFBO(Uint32 Width, Uint32 Height, GLContextState& ContextState)
{
    FBOCacheKey Key;
    Key.Width  = Width;
    Key.Height = Height;

    // Lock the cache
    Threading::SpinLockGuard CacheGuard{m_CacheLock};

    // Try to find FBO in the map
    auto fbo_it = m_Cache.find(Key);
    if (fbo_it == m_Cache.end())
    {
        // Create a new FBO
        GLObjectWrappers::GLFrameBufferObj NewFBO = CreateFBO(ContextState, 0, nullptr, nullptr, Width, Height);

        auto it_inserted = m_Cache.emplace(Key, std::move(NewFBO));
        // New FBO must be actually inserted
        VERIFY(it_inserted.second, "New FBO was not inserted");
        fbo_it = it_inserted.first;
    }
    return fbo_it->second;
}